

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect4.c
# Opt level: O0

lws * lws_client_connect_4_established(lws *wsi,lws *wsi_piggyback,ssize_t plen)

{
  lws_context *plVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  lws_callback_reasons reason;
  char *pcVar5;
  ssize_t sVar6;
  lws_log_cx *plVar7;
  size_t len;
  int iVar8;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar9;
  char *pcVar10;
  char *pcVar11;
  int result;
  char *cpa;
  int rawish;
  int m;
  int n;
  char *cce;
  pollfd pfd;
  char *meth;
  lws_context_per_thread *pt;
  ssize_t plen_local;
  lws *wsi_piggyback_local;
  lws *wsi_local;
  
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  plVar1 = (wsi->a).context;
  iVar8 = (int)wsi->tsi;
  _m = "";
  cpa._4_4_ = 0;
  pfd = (pollfd)lws_wsi_client_stash_item(wsi,5,0x5d);
  if ((pfd != (pollfd)0x0) && (iVar2 = strcmp((char *)pfd,"RAW"), iVar2 == 0)) {
    cpa._4_4_ = 1;
  }
  if (wsi_piggyback == (lws *)0x0) {
    if ((((wsi->a).vhost)->http).http_proxy_port != 0) {
      pcVar5 = lws_wsi_client_stash_item(wsi,0,0x59);
      if (pcVar5 != (char *)0x0) {
        plVar7 = lwsl_wsi_get_cx(wsi);
        _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,8,"lws_client_connect_4_established",
                    "going via proxy");
        iVar2 = lws_snprintf((char *)plVar1->pt[iVar8].serv_buf,0x100,
                             "CONNECT %s:%u HTTP/1.1\r\nHost: %s:%u\r\nUser-agent: lws\r\n",pcVar5,
                             (ulong)wsi->ocport,pcVar5,CONCAT44(uVar9,(uint)wsi->ocport));
        pt = (lws_context_per_thread *)(long)iVar2;
        if (((wsi->a).vhost)->proxy_basic_auth_token[0] != '\0') {
          iVar2 = lws_snprintf((char *)(plVar1->pt[iVar8].serv_buf +
                                       (long)&(((lws_context_per_thread *)(pt->pt_sul_owner + -3))->
                                              dll_buflist_owner).tail),0x100,
                               "Proxy-authorization: basic %s\r\n",(wsi->a).vhost);
          pt = (lws_context_per_thread *)
               ((long)&(((lws_context_per_thread *)(pt->pt_sul_owner + -3))->dll_buflist_owner).tail
               + (long)iVar2);
        }
        iVar2 = lws_snprintf((char *)(plVar1->pt[iVar8].serv_buf +
                                     (long)&(((lws_context_per_thread *)(pt->pt_sul_owner + -3))->
                                            dll_buflist_owner).tail),5,"\r\n");
        if (wsi->stash == (client_info_stash *)0x0) {
          iVar3 = lws_hdr_simple_create
                            (wsi,_WSI_TOKEN_CLIENT_PEER_ADDRESS,
                             (((wsi->a).vhost)->http).http_proxy_address);
          if (iVar3 != 0) goto LAB_00126768;
        }
        else {
          wsi->stash->cis[0] = (((wsi->a).vhost)->http).http_proxy_address;
        }
        wsi->c_port = (uint16_t)(((wsi->a).vhost)->http).http_proxy_port;
        sVar6 = send((wsi->desc).sockfd,plVar1->pt[iVar8].serv_buf,
                     (long)&(((lws_context_per_thread *)(pt->pt_sul_owner + -3))->dll_buflist_owner)
                            .tail + (long)iVar2 & 0xffffffff,0x4000);
        if (-1 < (int)sVar6) {
          lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_PROXY_RESPONSE,
                          ((wsi->a).context)->timeout_secs);
          wsi->conn_port = wsi->c_port;
          lwsi_set_state(wsi,0x203);
          return wsi;
        }
        plVar7 = lwsl_wsi_get_cx(wsi);
        _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,0x10,"lws_client_connect_4_established",
                    "ERROR writing to proxy socket");
        _m = "proxy write failed";
      }
      goto LAB_00126768;
    }
    if ((wsi->a).protocol == (lws_protocols *)0x0) {
      return (lws *)0x0;
    }
  }
  if ((wsi_piggyback != (lws *)0x0) &&
     (iVar8 = lws_dll2_is_detached(&wsi->dll2_cli_txn_queue), iVar8 == 0)) {
    lwsi_set_state(wsi,0x10f);
    lws_callback_on_writable(wsi_piggyback);
    plVar7 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,8,"lws_client_connect_4_established",
                "waiting to send hdrs (par state 0x%x)",
                CONCAT44(uVar9,wsi_piggyback->wsistate) & 0xffffffff0000ffff);
    return wsi;
  }
  plVar7 = lwsl_wsi_get_cx(wsi);
  pcVar5 = wsi->role_ops->name;
  pcVar10 = ((wsi->a).protocol)->name;
  pcVar11 = ((wsi->a).vhost)->name;
  uVar4 = wsi->wsistate & 0xffff;
  iVar8 = cpa._4_4_;
  _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,8,"lws_client_connect_4_established",
              "%s %s client created own conn (raw %d) vh %s st 0x%x",pcVar5,pcVar10,cpa._4_4_,
              pcVar11,uVar4);
  if (cpa._4_4_ == 0) {
    if ((wsi->wsistate & 0xffff) != 0x13) {
      lwsi_set_state(wsi,0x12);
    }
  }
  else {
    if (((wsi->wsistate & 0xffff) != 0x202) || (((wsi->tls).use_ssl & 1) == 0)) {
      lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
      reason = (lws_callback_reasons)wsi->role_ops->adoption_cb[0];
      if ((reason == LWS_CALLBACK_ESTABLISHED) ||
         (iVar2 = user_callback_handle_rxflow
                            (((wsi->a).protocol)->callback,wsi,reason,wsi->user_space,(void *)0x0,0)
         , -1 < iVar2)) {
        *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xfffffffffffffffe | 1;
        plVar7 = lwsl_wsi_get_cx(wsi);
        _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,8,"lws_client_connect_4_established",
                    "setting ESTABLISHED",pcVar5,pcVar10,iVar8,pcVar11,uVar4);
        lwsi_set_state(wsi,0x119);
        return wsi;
      }
      plVar7 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,8,"lws_client_connect_4_established",
                  "RAW_PROXY_CLI_ADOPT err",pcVar5,pcVar10,iVar8,pcVar11,uVar4);
      goto LAB_00126768;
    }
    iVar2 = lws_client_create_tls(wsi,(char **)&m,1);
    if (iVar2 != 0) {
      if (iVar2 == 1) {
        plVar7 = lwsl_wsi_get_cx(wsi);
        _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,0x10,"lws_client_connect_4_established",
                    "create_tls RETRY",pcVar5,pcVar10,iVar8,pcVar11,uVar4);
        return wsi;
      }
      plVar7 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,0x10,"lws_client_connect_4_established",
                  "create_tls FAIL",pcVar5,pcVar10,iVar8,pcVar11,uVar4);
      goto LAB_00126768;
    }
    plVar7 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,4,"lws_client_connect_4_established",
                "tls established st 0x%x, client_h2_alpn %d",
                CONCAT44((int)((ulong)pcVar5 >> 0x20),wsi->wsistate) & 0xffffffff0000ffff,
                CONCAT44((int)((ulong)pcVar10 >> 0x20),
                         (uint)((ulong)*(undefined8 *)&wsi->field_0x46e >> 0x3a)) &
                0xffffffff00000001,iVar8,pcVar11,uVar4);
    if ((wsi->wsistate & 0xffff) != 0x10f) {
      lwsi_set_state(wsi,0x13);
    }
    lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_CLIENT_HS_SEND,((wsi->a).context)->timeout_secs);
  }
  lws_set_timeout(wsi,PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE,((wsi->a).context)->timeout_secs);
  if ((wsi->desc).sockfd == -1) {
    __assert_fail("lws_socket_is_valid(wsi->desc.sockfd)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/client/connect4.c"
                  ,0x13b,
                  "struct lws *lws_client_connect_4_established(struct lws *, struct lws *, ssize_t)"
                 );
  }
  cce._0_4_ = wsi->desc;
  cce._4_2_ = 1;
  cce._6_2_ = 1;
  iVar8 = lws_service_fd((wsi->a).context,(pollfd *)&cce);
  if (-1 < iVar8) {
    if (iVar8 == 0) {
      return wsi;
    }
    return (lws *)0x0;
  }
  _m = "first service failed";
LAB_00126768:
  pcVar5 = _m;
  len = strlen(_m);
  lws_inform_client_conn_fail(wsi,pcVar5,len);
  lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"client_connect4");
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_client_connect_4_established(struct lws *wsi, struct lws *wsi_piggyback,
				 ssize_t plen)
{
#if defined(LWS_CLIENT_HTTP_PROXYING)
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
#endif
	const char *meth;
	struct lws_pollfd pfd;
	const char *cce = "";
	int n, m, rawish = 0;

	meth = lws_wsi_client_stash_item(wsi, CIS_METHOD,
					 _WSI_TOKEN_CLIENT_METHOD);

	if (meth && (!strcmp(meth, "RAW")
#if defined(LWS_ROLE_MQTT)
		     || !strcmp(meth, "MQTT")
#endif
	))
		rawish = 1;

	if (wsi_piggyback)
		goto send_hs;

#if defined(LWS_CLIENT_HTTP_PROXYING)
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	/* we are connected to server, or proxy */

	/* http proxy */
	if (wsi->a.vhost->http.http_proxy_port) {
		const char *cpa;

		cpa = lws_wsi_client_stash_item(wsi, CIS_ADDRESS,
						_WSI_TOKEN_CLIENT_PEER_ADDRESS);
		if (!cpa)
			goto failed;

		lwsl_wsi_info(wsi, "going via proxy");

		plen = lws_snprintf((char *)pt->serv_buf, 256,
			"CONNECT %s:%u HTTP/1.1\x0d\x0a"
			"Host: %s:%u\x0d\x0a"
			"User-agent: lws\x0d\x0a", cpa, wsi->ocport,
						   cpa, wsi->ocport);

#if defined(LWS_WITH_HTTP_BASIC_AUTH)
		if (wsi->a.vhost->proxy_basic_auth_token[0])
			plen += lws_snprintf((char *)pt->serv_buf + plen, 256,
					"Proxy-authorization: basic %s\x0d\x0a",
					wsi->a.vhost->proxy_basic_auth_token);
#endif

		plen += lws_snprintf((char *)pt->serv_buf + plen, 5,
					"\x0d\x0a");

		/* lwsl_hexdump_notice(pt->serv_buf, plen); */

		/*
		 * OK from now on we talk via the proxy, so connect to that
		 */
		if (wsi->stash)
			wsi->stash->cis[CIS_ADDRESS] =
				wsi->a.vhost->http.http_proxy_address;
		else
			if (lws_hdr_simple_create(wsi,
					_WSI_TOKEN_CLIENT_PEER_ADDRESS,
					wsi->a.vhost->http.http_proxy_address))
			goto failed;
		wsi->c_port = (uint16_t)wsi->a.vhost->http.http_proxy_port;

		n = (int)send(wsi->desc.sockfd, (char *)pt->serv_buf,
			      (unsigned int)plen,
			 MSG_NOSIGNAL);
		if (n < 0) {
			lwsl_wsi_debug(wsi, "ERROR writing to proxy socket");
			cce = "proxy write failed";
			goto failed;
		}

		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_PROXY_RESPONSE,
				(int)wsi->a.context->timeout_secs);

		wsi->conn_port = wsi->c_port;
		lwsi_set_state(wsi, LRS_WAITING_PROXY_REPLY);

		return wsi;
	}
#endif
#endif

	/* coverity */
	if (!wsi->a.protocol)
		return NULL;

#if defined(LWS_WITH_SOCKS5)
	if (lwsi_state(wsi) != 	LRS_ESTABLISHED)
		switch (lws_socks5c_greet(wsi, &cce)) {
		case -1:
			goto failed;
		case 1:
			return wsi;
		default:
			break;
		}
#endif

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
send_hs:

	if (wsi_piggyback &&
	    !lws_dll2_is_detached(&wsi->dll2_cli_txn_queue)) {
		/*
		 * We are pipelining on an already-established connection...
		 * we can skip tls establishment.
		 *
		 * Set these queued guys to a state where they won't actually
		 * send their headers until we decide later.
		 */

		lwsi_set_state(wsi, LRS_H2_WAITING_TO_SEND_HEADERS);

		/*
		 * we can't send our headers directly, because they have to
		 * be sent when the parent is writeable.  The parent will check
		 * for anybody on his client transaction queue that is in
		 * LRS_H1C_ISSUE_HANDSHAKE2, and let them write.
		 *
		 * If we are trying to do this too early, before the network
		 * connection has written his own headers, then it will just
		 * wait in the queue until it's possible to send them.
		 */
		lws_callback_on_writable(wsi_piggyback);

		lwsl_wsi_info(wsi, "waiting to send hdrs (par state 0x%x)",
			      lwsi_state(wsi_piggyback));
	} else {
		lwsl_wsi_info(wsi, "%s %s client created own conn "
			  "(raw %d) vh %s st 0x%x",
			  wsi->role_ops->name, wsi->a.protocol->name, rawish,
			  wsi->a.vhost->name, lwsi_state(wsi));

		/* we are making our own connection */

		if (!rawish
#if defined(LWS_WITH_TLS)
		    // && (!(wsi->tls.use_ssl & LCCSCF_USE_SSL) || wsi->tls.ssl)
#endif
		    ) {

			if (lwsi_state(wsi) != LRS_H1C_ISSUE_HANDSHAKE2)
				lwsi_set_state(wsi, LRS_H1C_ISSUE_HANDSHAKE);
		} else {
			/* for a method = "RAW" connection, this makes us
			 * established */

#if defined(LWS_WITH_TLS)// && !defined(LWS_WITH_MBEDTLS)

			/* we have connected if we got here */

			if (lwsi_state(wsi) == LRS_WAITING_CONNECT &&
			    (wsi->tls.use_ssl & LCCSCF_USE_SSL)) {
				int result;

				//lwsi_set_state(wsi, LRS_WAITING_SSL);

				/*
				 * We can retry this... just cook the SSL BIO
				 * the first time
				 */

				result = lws_client_create_tls(wsi, &cce, 1);
				switch (result) {
				case CCTLS_RETURN_DONE:
					break;
				case CCTLS_RETURN_RETRY:
					lwsl_wsi_debug(wsi, "create_tls RETRY");
					return wsi;
				default:
					lwsl_wsi_debug(wsi, "create_tls FAIL");
					goto failed;
				}

				/*
				 * We succeeded to negotiate a new client tls
				 * tunnel.  If it's h2 alpn, we have arranged
				 * to send the h2 prefix and set our state to
				 * LRS_H2_WAITING_TO_SEND_HEADERS already.
				 */

				lwsl_wsi_notice(wsi, "tls established st 0x%x, "
					    "client_h2_alpn %d", lwsi_state(wsi),
					    wsi->client_h2_alpn);

				if (lwsi_state(wsi) !=
						LRS_H2_WAITING_TO_SEND_HEADERS)
					lwsi_set_state(wsi,
						LRS_H1C_ISSUE_HANDSHAKE2);
				lws_set_timeout(wsi,
					PENDING_TIMEOUT_AWAITING_CLIENT_HS_SEND,
					(int)wsi->a.context->timeout_secs);
#if 0
				/* ensure pollin enabled */
				if (lws_change_pollfd(wsi, 0, LWS_POLLIN))
					lwsl_wsi_notice(wsi,
							"unable to set POLLIN");
#endif

				goto provoke_service;
			}
#endif

			/* clear his established timeout */
			lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

			m = wsi->role_ops->adoption_cb[0];
			if (m) {
				n = user_callback_handle_rxflow(
						wsi->a.protocol->callback, wsi,
						(enum lws_callback_reasons)m,
						wsi->user_space, NULL, 0);
				if (n < 0) {
					lwsl_wsi_info(wsi, "RAW_PROXY_CLI_ADOPT err");
					goto failed;
				}
			}

			/* service.c pollout processing wants this */
			wsi->hdr_parsing_completed = 1;
#if defined(LWS_ROLE_MQTT)
			if (meth && !strcmp(meth, "MQTT")) {
#if defined(LWS_WITH_TLS)
				if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
					lwsi_set_state(wsi, LRS_WAITING_SSL);
					return wsi;
				}
#endif
				lwsl_wsi_info(wsi, "settings LRS_MQTTC_IDLE");
				lwsi_set_state(wsi, LRS_MQTTC_IDLE);

				/*
				 * provoke service to issue the CONNECT
				 * directly.
				 */
				lws_set_timeout(wsi,
					PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE,
						(int)wsi->a.context->timeout_secs);

				assert(lws_socket_is_valid(wsi->desc.sockfd));

				pfd.fd = wsi->desc.sockfd;
				pfd.events = LWS_POLLIN;
				pfd.revents = LWS_POLLOUT;

				lwsl_wsi_info(wsi, "going to service fd");
				n = lws_service_fd(wsi->a.context, &pfd);
				if (n < 0) {
					cce = "first service failed";
					goto failed;
				}
				if (n)
					/* returns 1 on fail after close wsi */
					return NULL;
				return wsi;
			}
#endif
			lwsl_wsi_info(wsi, "setting ESTABLISHED");
			lwsi_set_state(wsi, LRS_ESTABLISHED);

			return wsi;
		}

		/*
		 * provoke service to issue the handshake directly.
		 *
		 * we need to do it this way because in the proxy case, this is
		 * the next state and executed only if and when we get a good
		 * proxy response inside the state machine... but notice in
		 * SSL case this may not have sent anything yet with 0 return,
		 * and won't until many retries from main loop.  To stop that
		 * becoming endless, cover with a timeout.
		 */
#if defined(LWS_WITH_TLS) //&& !defined(LWS_WITH_MBEDTLS)
provoke_service:
#endif
		lws_set_timeout(wsi, PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE,
				(int)wsi->a.context->timeout_secs);

		assert(lws_socket_is_valid(wsi->desc.sockfd));

		pfd.fd = wsi->desc.sockfd;
		pfd.events = LWS_POLLIN;
		pfd.revents = LWS_POLLIN;

		n = lws_service_fd(wsi->a.context, &pfd);
		if (n < 0) {
			cce = "first service failed";
			goto failed;
		}
		if (n) /* returns 1 on failure after closing wsi */
			return NULL;
	}
#endif
	return wsi;

failed:
	lws_inform_client_conn_fail(wsi, (void *)cce, strlen(cce));

	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "client_connect4");

	return NULL;
}